

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O3

bool __thiscall leveldb::log::Reader::ReadRecord(Reader *this,Slice *record,string *scratch)

{
  size_t sVar1;
  size_t __len2;
  bool bVar2;
  uint uVar3;
  char *reason;
  uint64_t bytes;
  size_type sVar4;
  uint64_t uVar5;
  long in_FS_OFFSET;
  Slice fragment;
  char buf [40];
  uint64_t local_80;
  Slice local_78;
  char local_68 [48];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->last_record_offset_ < this->initial_offset_) {
    bVar2 = SkipToInitialBlock(this);
    if (!bVar2) {
LAB_00d19d38:
      bVar2 = false;
      goto LAB_00d19d61;
    }
  }
  bVar2 = false;
  scratch->_M_string_length = 0;
  *(scratch->_M_dataplus)._M_p = '\0';
  record->data_ = "";
  record->size_ = 0;
  local_78.data_ = "";
  local_78.size_ = 0;
  local_80 = 0;
LAB_00d19b81:
  uVar3 = ReadPhysicalRecord(this,&local_78);
  __len2 = local_78.size_;
  sVar1 = (this->buffer_).size_;
  if (this->resyncing_ == true) goto code_r0x00d19ba5;
  goto LAB_00d19bbb;
code_r0x00d19ba5:
  if (uVar3 != 3) {
    if (uVar3 == 4) {
      this->resyncing_ = false;
      goto LAB_00d19b81;
    }
    this->resyncing_ = false;
LAB_00d19bbb:
    if (uVar3 - 1 < 6) {
      uVar5 = (this->end_of_buffer_offset_ - (sVar1 + local_78.size_)) - 7;
      switch(uVar3) {
      case 1:
        goto switchD_00d19bd6_caseD_1;
      case 2:
        bytes = scratch->_M_string_length;
        if (bVar2) {
          if (bytes == 0) {
            bytes = 0;
          }
          else {
            ReportCorruption(this,bytes,"partial record without end(2)");
            bytes = scratch->_M_string_length;
          }
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (scratch,0,bytes,local_78.data_,__len2);
        bVar2 = true;
        local_80 = uVar5;
        goto LAB_00d19b81;
      case 3:
        if (bVar2) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (scratch,local_78.data_,local_78.size_);
        }
        else {
          ReportCorruption(this,local_78.size_,"missing start of fragmented record(1)");
        }
        goto LAB_00d19b81;
      case 4:
        if (bVar2) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (scratch,local_78.data_,local_78.size_);
          sVar4 = scratch->_M_string_length;
          record->data_ = (scratch->_M_dataplus)._M_p;
          record->size_ = sVar4;
          this->last_record_offset_ = local_80;
          goto LAB_00d19d5f;
        }
        ReportCorruption(this,local_78.size_,"missing start of fragmented record(2)");
        goto LAB_00d19b81;
      case 5:
        if (bVar2) {
          scratch->_M_string_length = 0;
          *(scratch->_M_dataplus)._M_p = '\0';
        }
        goto LAB_00d19d38;
      case 6:
        if (!bVar2) goto LAB_00d19b81;
        sVar4 = scratch->_M_string_length;
        reason = "error in middle of record";
      }
    }
    else {
      snprintf(local_68,0x28,"unknown record type %u",(ulong)uVar3);
      if (bVar2) {
        sVar4 = scratch->_M_string_length;
      }
      else {
        sVar4 = 0;
      }
      sVar4 = sVar4 + __len2;
      reason = local_68;
    }
    ReportCorruption(this,sVar4,reason);
    scratch->_M_string_length = 0;
    *(scratch->_M_dataplus)._M_p = '\0';
    bVar2 = false;
  }
  goto LAB_00d19b81;
switchD_00d19bd6_caseD_1:
  if ((bVar2) && (scratch->_M_string_length != 0)) {
    ReportCorruption(this,scratch->_M_string_length,"partial record without end(1)");
  }
  scratch->_M_string_length = 0;
  *(scratch->_M_dataplus)._M_p = '\0';
  record->data_ = local_78.data_;
  record->size_ = local_78.size_;
  this->last_record_offset_ = uVar5;
LAB_00d19d5f:
  bVar2 = true;
LAB_00d19d61:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool Reader::ReadRecord(Slice* record, std::string* scratch) {
  if (last_record_offset_ < initial_offset_) {
    if (!SkipToInitialBlock()) {
      return false;
    }
  }

  scratch->clear();
  record->clear();
  bool in_fragmented_record = false;
  // Record offset of the logical record that we're reading
  // 0 is a dummy value to make compilers happy
  uint64_t prospective_record_offset = 0;

  Slice fragment;
  while (true) {
    const unsigned int record_type = ReadPhysicalRecord(&fragment);

    // ReadPhysicalRecord may have only had an empty trailer remaining in its
    // internal buffer. Calculate the offset of the next physical record now
    // that it has returned, properly accounting for its header size.
    uint64_t physical_record_offset =
        end_of_buffer_offset_ - buffer_.size() - kHeaderSize - fragment.size();

    if (resyncing_) {
      if (record_type == kMiddleType) {
        continue;
      } else if (record_type == kLastType) {
        resyncing_ = false;
        continue;
      } else {
        resyncing_ = false;
      }
    }

    switch (record_type) {
      case kFullType:
        if (in_fragmented_record) {
          // Handle bug in earlier versions of log::Writer where
          // it could emit an empty kFirstType record at the tail end
          // of a block followed by a kFullType or kFirstType record
          // at the beginning of the next block.
          if (!scratch->empty()) {
            ReportCorruption(scratch->size(), "partial record without end(1)");
          }
        }
        prospective_record_offset = physical_record_offset;
        scratch->clear();
        *record = fragment;
        last_record_offset_ = prospective_record_offset;
        return true;

      case kFirstType:
        if (in_fragmented_record) {
          // Handle bug in earlier versions of log::Writer where
          // it could emit an empty kFirstType record at the tail end
          // of a block followed by a kFullType or kFirstType record
          // at the beginning of the next block.
          if (!scratch->empty()) {
            ReportCorruption(scratch->size(), "partial record without end(2)");
          }
        }
        prospective_record_offset = physical_record_offset;
        scratch->assign(fragment.data(), fragment.size());
        in_fragmented_record = true;
        break;

      case kMiddleType:
        if (!in_fragmented_record) {
          ReportCorruption(fragment.size(),
                           "missing start of fragmented record(1)");
        } else {
          scratch->append(fragment.data(), fragment.size());
        }
        break;

      case kLastType:
        if (!in_fragmented_record) {
          ReportCorruption(fragment.size(),
                           "missing start of fragmented record(2)");
        } else {
          scratch->append(fragment.data(), fragment.size());
          *record = Slice(*scratch);
          last_record_offset_ = prospective_record_offset;
          return true;
        }
        break;

      case kEof:
        if (in_fragmented_record) {
          // This can be caused by the writer dying immediately after
          // writing a physical record but before completing the next; don't
          // treat it as a corruption, just ignore the entire logical record.
          scratch->clear();
        }
        return false;

      case kBadRecord:
        if (in_fragmented_record) {
          ReportCorruption(scratch->size(), "error in middle of record");
          in_fragmented_record = false;
          scratch->clear();
        }
        break;

      default: {
        char buf[40];
        snprintf(buf, sizeof(buf), "unknown record type %u", record_type);
        ReportCorruption(
            (fragment.size() + (in_fragmented_record ? scratch->size() : 0)),
            buf);
        in_fragmented_record = false;
        scratch->clear();
        break;
      }
    }
  }
  return false;
}